

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

void __thiscall cmCTestP4::UserParser::UserParser(UserParser *this,cmCTestP4 *p4,char *prefix)

{
  char *prefix_local;
  cmCTestP4 *p4_local;
  UserParser *this_local;
  
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__UserParser_01670248;
  cmsys::RegularExpression::RegularExpression(&this->RegexUser);
  this->P4 = p4;
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(this->P4->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexUser,"^(.+) <(.*)> \\((.*)\\) accessed (.*)$");
  return;
}

Assistant:

UserParser(cmCTestP4* p4, const char* prefix)
    : P4(p4)
  {
    this->SetLog(&this->P4->Log, prefix);
    this->RegexUser.compile("^(.+) <(.*)> \\((.*)\\) accessed (.*)$");
  }